

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_parser.hpp
# Opt level: O0

void __thiscall
jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::
read_byte_string(basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>
                 *this,byte_string_type *v,error_code *ec)

{
  cbor_major_type cVar1;
  uint8_t uVar2;
  bool bVar3;
  char_result<unsigned_char> cVar4;
  undefined8 uVar5;
  size_t sVar6;
  type_conflict2 tVar7;
  mapped_string *__args;
  reference this_00;
  size_type index;
  mapped_string *pmVar8;
  error_code *in_RDX;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RSI;
  undefined8 in_RDI;
  size_t length;
  anon_class_8_1_54a39816 func;
  uint8_t info;
  cbor_major_type major_type;
  char_result<unsigned_char> c;
  string *in_stack_ffffffffffffff28;
  vector<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string>_>,_std::allocator<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string>_>_>_>
  *in_stack_ffffffffffffff30;
  stream_source<unsigned_char> *in_stack_ffffffffffffff38;
  cbor_errc __e;
  error_code *in_stack_ffffffffffffff40;
  basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>
  *in_stack_ffffffffffffff48;
  cbor_major_type type;
  anon_class_8_1_54a39816 *in_stack_ffffffffffffff58;
  basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>
  *in_stack_ffffffffffffff60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  uint8_t local_1a;
  
  type = (cbor_major_type)((ulong)in_RDI >> 0x38);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2e6cd9);
  cVar4 = stream_source<unsigned_char>::peek(in_stack_ffffffffffffff38);
  __e = (cbor_errc)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  if (((ushort)cVar4 & 0x100) == 0) {
    local_1a = cVar4.value;
    cVar1 = get_major_type(local_1a);
    uVar2 = get_additional_information_value(local_1a);
    if (cVar1 != byte_string) {
      uVar5 = __cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68,
                 (allocator<char> *)in_stack_ffffffffffffff60);
      assertion_error::assertion_error
                ((assertion_error *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      __cxa_throw(uVar5,&assertion_error::typeinfo,assertion_error::~assertion_error);
    }
    if (uVar2 == '\x1f') {
      basic_cbor_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::
      iterate_string_chunks<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::read_byte_string(std::vector<unsigned_char,std::allocator<unsigned_char>>&,std::error_code&)::_lambda(jsoncons::stream_source<unsigned_char>&,unsigned_long,std::error_code&)_1_>
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,type,
                 (error_code *)in_stack_ffffffffffffff48);
    }
    else {
      sVar6 = get_size(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
      bVar3 = std::error_code::operator_cast_to_bool(in_RDX);
      if (!bVar3) {
        tVar7 = source_reader<jsoncons::stream_source<unsigned_char>>::
                read<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                          ((stream_source<unsigned_char> *)in_stack_ffffffffffffff70,
                           in_stack_ffffffffffffff68,(size_t)in_stack_ffffffffffffff60);
        if (tVar7 == sVar6) {
          bVar3 = std::
                  vector<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string>_>,_std::allocator<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string>_>_>_>
                  ::empty((vector<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string>_>,_std::allocator<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string>_>_>_>
                           *)in_stack_ffffffffffffff40);
          if (!bVar3) {
            __args = (mapped_string *)
                     std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(in_RSI);
            this_00 = std::
                      vector<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string>_>,_std::allocator<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string>_>_>_>
                      ::back(in_stack_ffffffffffffff30);
            index = std::
                    vector<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string>_>
                    ::size(this_00);
            pmVar8 = (mapped_string *)detail::min_length_for_stringref(index);
            if (pmVar8 <= __args) {
              std::
              vector<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string>_>,_std::allocator<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string>_>_>_>
              ::back(in_stack_ffffffffffffff30);
              pmVar8 = (mapped_string *)&stack0xffffffffffffff58;
              mapped_string::mapped_string
                        ((mapped_string *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                         (allocator_type *)in_stack_ffffffffffffff60);
              std::
              vector<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::mapped_string,std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::mapped_string>>
              ::
              emplace_back<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::mapped_string>
                        ((vector<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string>_>
                          *)in_stack_ffffffffffffff40,__args);
              mapped_string::~mapped_string(pmVar8);
            }
          }
        }
        else {
          std::error_code::operator=(in_stack_ffffffffffffff40,__e);
        }
      }
    }
  }
  else {
    std::error_code::operator=(in_stack_ffffffffffffff40,__e);
  }
  return;
}

Assistant:

void read_byte_string(byte_string_type& v, std::error_code& ec)
    {
        v.clear();
        auto c = source_.peek();
        if (JSONCONS_UNLIKELY(c.eof))
        {
            ec = cbor_errc::unexpected_eof;
            return;
        }
        jsoncons::cbor::detail::cbor_major_type major_type = get_major_type(c.value);
        uint8_t info = get_additional_information_value(c.value);

        JSONCONS_ASSERT(major_type == jsoncons::cbor::detail::cbor_major_type::byte_string);

        switch(info)
        {
            case jsoncons::cbor::detail::additional_info::indefinite_length:
            {
                auto func = [&v](Source& source, std::size_t length, std::error_code& ec) -> bool
                {
                    if (source_reader<Source>::read(source, v, length) != length)
                    {
                        ec = cbor_errc::unexpected_eof;
                        return false;
                    }
                    return true;
                };
                iterate_string_chunks(func, major_type, ec);
                break;
            }
            default:
            {
                std::size_t length = get_size(ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                if (source_reader<Source>::read(source_, v, length) != length)
                {
                    ec = cbor_errc::unexpected_eof;
                    return;
                }
                if (!stringref_map_stack_.empty() &&
                    v.size() >= jsoncons::cbor::detail::min_length_for_stringref(stringref_map_stack_.back().size()))
                {
                    stringref_map_stack_.back().emplace_back(mapped_string(v, alloc_));
                }
                break;
            }

        }
    }